

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
::
ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>::VarHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
           *this)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  BinaryReaderBase *this_00;
  ArgList local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar2 = **(int **)(this + 8);
  if (0 < iVar2) {
    do {
      this_00 = *(BinaryReaderBase **)this;
      pcVar1 = (this_00->super_ReaderBase).ptr_;
      (this_00->super_ReaderBase).token_ = pcVar1;
      pcVar3 = pcVar1 + 1;
      (this_00->super_ReaderBase).ptr_ = pcVar3;
      switch(*pcVar1) {
      case '0':
        (this_00->super_ReaderBase).token_ = pcVar3;
        BinaryReaderBase::Read(this_00,8);
        this_00 = *(BinaryReaderBase **)this;
        pcVar3 = (this_00->super_ReaderBase).ptr_;
      case '1':
      case '2':
      case '4':
        (this_00->super_ReaderBase).token_ = pcVar3;
        BinaryReaderBase::Read(this_00,8);
        break;
      case '3':
        break;
      case '5':
        pcVar3 = "COMPL bound type is invalid for variables";
        goto LAB_00125a66;
      default:
        pcVar3 = "expected bound";
LAB_00125a66:
        uStack_40 = 0;
        local_48 = 0;
        local_58.types_ = 0;
        local_58.field_1.values_ = (Value *)&local_48;
        BinaryReaderBase::ReportError(this_00,(CStringRef)pcVar3,&local_58);
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

int num_items() const { return this->reader_.header_.num_vars; }